

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O1

boolean check_tutorial_oclass(int oclass)

{
  boolean bVar1;
  
  switch(oclass) {
  case 2:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[100] < '\x01')) {
      pl_tutorial[100] = '\x01';
      tutorial_latest_message = 0x12d;
LAB_0026e160:
      com_pager(tutorial_latest_message);
      return '\x01';
    }
    break;
  case 3:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x65] < '\x01')) {
      pl_tutorial[0x65] = '\x01';
      tutorial_latest_message = 0x12e;
      goto LAB_0026e160;
    }
    break;
  case 4:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x69] < '\x01')) {
      pl_tutorial[0x69] = '\x01';
      tutorial_latest_message = 0x132;
      goto LAB_0026e160;
    }
    break;
  case 5:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x6d] < '\x01')) {
      pl_tutorial[0x6d] = '\x01';
      tutorial_latest_message = 0x136;
      goto LAB_0026e160;
    }
    break;
  case 6:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x6b] < '\x01')) {
      pl_tutorial[0x6b] = '\x01';
      tutorial_latest_message = 0x134;
      goto LAB_0026e160;
    }
    break;
  case 7:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x66] < '\x01')) {
      pl_tutorial[0x66] = '\x01';
      tutorial_latest_message = 0x12f;
      goto LAB_0026e160;
    }
    break;
  case 8:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x6a] < '\x01')) {
      pl_tutorial[0x6a] = '\x01';
      tutorial_latest_message = 0x133;
      goto LAB_0026e160;
    }
    break;
  case 9:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x67] < '\x01')) {
      pl_tutorial[0x67] = '\x01';
      tutorial_latest_message = 0x130;
      goto LAB_0026e160;
    }
    break;
  case 10:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x70] < '\x01')) {
      pl_tutorial[0x70] = '\x01';
      tutorial_latest_message = 0x139;
      goto LAB_0026e160;
    }
    break;
  case 0xb:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x68] < '\x01')) {
      pl_tutorial[0x68] = '\x01';
      tutorial_latest_message = 0x131;
      goto LAB_0026e160;
    }
    break;
  case 0xc:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[99] < '\x01')) {
      pl_tutorial[99] = '\x01';
      tutorial_latest_message = 300;
      goto LAB_0026e160;
    }
    break;
  case 0xd:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x6e] < '\x01')) {
      pl_tutorial[0x6e] = '\x01';
      tutorial_latest_message = 0x137;
      goto LAB_0026e160;
    }
    break;
  case 0xe:
    bVar1 = '\x01';
    if ((flags.tutorial != '\0') && (pl_tutorial[0x6f] < '\x01')) {
      pl_tutorial[0x6f] = '\x01';
      tutorial_latest_message = 0x138;
      goto LAB_0026e160;
    }
    break;
  default:
    bVar1 = '\0';
  }
  return bVar1;
}

Assistant:

boolean check_tutorial_oclass(int oclass)
{
	switch(oclass) {
	case WEAPON_CLASS: check_tutorial_message(QT_T_ITEM_WEAPON);	return TRUE;
	case FOOD_CLASS:   check_tutorial_message(QT_T_ITEM_FOOD);	return TRUE;
	case GEM_CLASS:    check_tutorial_message(QT_T_ITEM_GEM);	return TRUE;
	case TOOL_CLASS:   check_tutorial_message(QT_T_ITEM_TOOL);	return TRUE;
	case AMULET_CLASS: check_tutorial_message(QT_T_ITEM_AMULET);	return TRUE;
	case POTION_CLASS: check_tutorial_message(QT_T_ITEM_POTION);	return TRUE;
	case SCROLL_CLASS: check_tutorial_message(QT_T_ITEM_SCROLL);	return TRUE;
	case SPBOOK_CLASS: check_tutorial_message(QT_T_ITEM_BOOK);	return TRUE;
	case ARMOR_CLASS:  check_tutorial_message(QT_T_ITEM_ARMOR);	return TRUE;
	case WAND_CLASS:   check_tutorial_message(QT_T_ITEM_WAND);	return TRUE;
	case RING_CLASS:   check_tutorial_message(QT_T_ITEM_RING);	return TRUE;
	case ROCK_CLASS:   check_tutorial_message(QT_T_ITEM_STATUE);	return TRUE;
	case COIN_CLASS:   check_tutorial_message(QT_T_ITEM_GOLD);	return TRUE;
	default: return FALSE; /* venom/ball/chain/mimic don't concern us */
	}
}